

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O2

float webrtc::GetMinimumSpacing
                (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 *array_geometry)

{
  undefined8 uVar1;
  pointer pCVar2;
  string *result;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  pointer pCVar6;
  float *pfVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint local_18c;
  FatalMessage local_188;
  
  local_188._0_8_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(array_geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_18c = 1;
  result = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                     ((unsigned_long *)&local_188,&local_18c,"array_geometry.size() > 1u");
  if (result == (string *)0x0) {
    pCVar2 = (array_geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(array_geometry->
                   super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0xc;
    pfVar4 = pCVar2[1].c + 2;
    fVar9 = 3.4028235e+38;
    uVar5 = 0;
    while (uVar5 != uVar3 - 1) {
      pCVar6 = pCVar2 + uVar5;
      uVar5 = uVar5 + 1;
      pfVar7 = pfVar4;
      for (uVar8 = uVar5; uVar8 < uVar3; uVar8 = uVar8 + 1) {
        uVar1 = *(undefined8 *)pCVar6->c;
        fVar10 = (float)uVar1 - (float)*(undefined8 *)((CartesianPoint<float> *)(pfVar7 + -2))->c;
        fVar11 = (float)((ulong)uVar1 >> 0x20) -
                 (float)((ulong)*(undefined8 *)((CartesianPoint<float> *)(pfVar7 + -2))->c >> 0x20);
        fVar12 = pCVar6->c[2] - *pfVar7;
        fVar10 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
        if (fVar9 <= fVar10) {
          fVar10 = fVar9;
        }
        fVar9 = fVar10;
        pfVar7 = pfVar7 + 3;
      }
      pfVar4 = pfVar4 + 3;
    }
    return fVar9;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
             ,0x1a,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

float GetMinimumSpacing(const std::vector<Point>& array_geometry) {
  RTC_CHECK_GT(array_geometry.size(), 1u);
  float mic_spacing = std::numeric_limits<float>::max();
  for (size_t i = 0; i < (array_geometry.size() - 1); ++i) {
    for (size_t j = i + 1; j < array_geometry.size(); ++j) {
      mic_spacing =
          std::min(mic_spacing, Distance(array_geometry[i], array_geometry[j]));
    }
  }
  return mic_spacing;
}